

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# immediate_operations.c
# Opt level: O3

void immediate_operations(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  status_register_t *psVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar2 = thminstr->raw;
  uVar7 = (ulong)(uVar2 >> 8 & 7);
  bVar4 = (byte)uVar2;
  switch(uVar2 >> 0xb & 3) {
  case 0:
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",uVar7,(ulong)bVar4);
    }
    state->r[uVar7] = (uint)bVar4;
    cVar1 = *(char *)thminstr;
    psVar5 = get_psr(state);
    psVar5->raw = psVar5->raw & 0x3fffffff | (uint)(cVar1 == '\0') << 0x1e;
    return;
  case 1:
    uVar3 = state->r[uVar7];
    psVar5 = get_psr(state);
    uVar6 = uVar3 - bVar4;
    psVar5->raw = uVar6 & 0x80000000 | (uint)(uVar6 == 0) << 0x1e | psVar5->raw & 0x3fffffff;
    (state->cpsr).raw =
         (~uVar6 & uVar3) >> 3 & 0x10000000 | (state->cpsr).raw & 0xcfffffff |
         (uint)(*(byte *)thminstr <= uVar3) << 0x1d;
    return;
  case 2:
    uVar3 = state->r[uVar7];
    uVar6 = uVar3 + bVar4;
    (state->cpsr).raw =
         ((uint)((ulong)bVar4 + (ulong)uVar3) & ~uVar3) >> 3 & 0x10000000 |
         (state->cpsr).raw & 0xcfffffff | (int)((ulong)bVar4 + (ulong)uVar3 >> 0x20) << 0x1d;
    psVar5 = get_psr(state);
    psVar5->raw = uVar6 & 0x80000000 | (uint)(uVar6 == 0) << 0x1e | psVar5->raw & 0x3fffffff;
    break;
  case 3:
    uVar3 = state->r[uVar7];
    uVar6 = uVar3 - bVar4;
    (state->cpsr).raw =
         (~uVar6 & uVar3) >> 3 & 0x10000000 |
         (state->cpsr).raw & 0xcfffffff | (uint)(bVar4 <= uVar3) << 0x1d;
    psVar5 = get_psr(state);
    psVar5->raw = uVar6 & 0x80000000 | (uint)(uVar6 == 0) << 0x1e | psVar5->raw & 0x3fffffff;
  }
  uVar7 = (ulong)(*(byte *)((long)thminstr + 1) & 7);
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",uVar7,(ulong)uVar6);
  }
  state->r[uVar7] = uVar6;
  return;
}

Assistant:

void immediate_operations(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    immediate_operations_t* instr = &thminstr->IMMEDIATE_OPERATIONS;
    switch (instr->opcode) {
        case 0: // MOV
            set_register(state, instr->rd, instr->offset);
            set_flags_nz(state, instr->offset);
            break;
        case 1: { // CMP
            word rddata = get_register(state, instr->rd);
            word result = rddata - instr->offset;
            set_flags_nz(state, result);
            set_flags_sub(state, rddata, instr->offset, result);
            break;
        }
        case 2: { // ADD
            word rddata = get_register(state, instr->rd);
            word result = rddata + instr->offset;
            set_flags_add(state, rddata, instr->offset);
            set_flags_nz(state, result);
            set_register(state, instr->rd, result);
            break;
        }
        case 3: { // SUB
            word rddata = get_register(state, instr->rd);
            word result = rddata - instr->offset;
            set_flags_sub(state, rddata, result, instr->offset);
            set_flags_nz(state, result);
            set_register(state, instr->rd, result);
            break;
        }
        default:
            logfatal("immediate_operations: opc: %d rd: %d offset: %d", instr->opcode, instr->rd, instr->offset)
    }
}